

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O2

void __thiscall
Vault::Client::Client(Client *this,Config *config,AuthenticationStrategy *authStrategy)

{
  optional<Vault::AuthenticationResponse> result;
  _Optional_payload_base<Vault::AuthenticationResponse> local_128;
  Config local_e0;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_001c5990;
  this->debug_ = config->debug_;
  this->tls_ = config->tls_;
  std::__cxx11::string::string((string *)&this->host_,(string *)&config->host_);
  std::__cxx11::string::string((string *)&this->port_,(string *)&config->port_);
  (this->token_).value_._M_dataplus._M_p = (pointer)&(this->token_).value_.field_2;
  (this->token_).value_._M_string_length = 0;
  (this->token_).value_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->namespace_,(string *)&config->ns_);
  Config::Config(&local_e0,config);
  HttpClient::HttpClient(&this->httpClient_,&local_e0);
  Config::~Config(&local_e0);
  this->authStrategy_ = authStrategy;
  std::filesystem::__cxx11::path::path(&this->caBundle_,&config->caBundle_);
  (*this->authStrategy_->_vptr_AuthenticationStrategy[2])(&local_128,this->authStrategy_,this);
  if (local_128._M_engaged == true) {
    std::__cxx11::string::_M_assign((string *)&this->token_);
  }
  std::_Optional_payload_base<Vault::AuthenticationResponse>::_M_reset(&local_128);
  return;
}

Assistant:

Vault::Client::Client(Vault::Config &config,
                      AuthenticationStrategy &authStrategy)
    : debug_(config.getDebug())
    , tls_(config.getTls())
    , host_(config.getHost())
    , port_(config.getPort())
    , namespace_(config.getNamespace())
    , httpClient_(HttpClient(config))
    , authStrategy_(authStrategy)
    , caBundle_(config.getCaBundle()) {
  if (auto result = authStrategy_.authenticate(*this)) {
    token_ = result.value().token;
  }
}